

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

int nk_selectable_symbol_text
              (nk_context *ctx,nk_symbol_type sym,char *str,int len,nk_flags align,int *value)

{
  float fVar1;
  float fVar2;
  int iVar3;
  nk_window *pnVar4;
  nk_panel *pnVar5;
  nk_user_font *font;
  _func_void_nk_command_buffer_ptr_nk_handle *p_Var6;
  ulong uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  nk_widget_layout_states nVar10;
  int iVar11;
  undefined4 in_register_0000000c;
  nk_context *i;
  undefined4 in_register_00000084;
  nk_command_buffer *out;
  float fVar12;
  nk_rect r;
  nk_rect local_8c;
  float local_7c;
  float local_78;
  float local_74;
  ulong local_70;
  undefined8 local_68;
  char *local_60;
  nk_rect local_58;
  ulong local_48;
  nk_rect bounds;
  
  local_70 = CONCAT44(in_register_00000084,align);
  local_68 = CONCAT44(in_register_0000000c,len);
  local_60 = str;
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x50de,
                  "int nk_selectable_symbol_text(struct nk_context *, enum nk_symbol_type, const char *, int, nk_flags, int *)"
                 );
  }
  if (value == (int *)0x0) {
    __assert_fail("value",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x50df,
                  "int nk_selectable_symbol_text(struct nk_context *, enum nk_symbol_type, const char *, int, nk_flags, int *)"
                 );
  }
  pnVar4 = ctx->current;
  if (pnVar4 == (nk_window *)0x0) {
    __assert_fail("ctx->current",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x50e0,
                  "int nk_selectable_symbol_text(struct nk_context *, enum nk_symbol_type, const char *, int, nk_flags, int *)"
                 );
  }
  pnVar5 = pnVar4->layout;
  if (pnVar5 != (nk_panel *)0x0) {
    uVar7 = (ulong)sym;
    nVar10 = nk_widget(&bounds,ctx);
    if (nVar10 != NK_WIDGET_INVALID) {
      if (nVar10 == NK_WIDGET_ROM) {
        i = (nk_context *)0x0;
      }
      else {
        i = (nk_context *)0x0;
        if ((pnVar5->flags & 0x1000) == 0) {
          i = ctx;
        }
      }
      font = (ctx->style).font;
      local_58.x = bounds.x;
      local_58.y = bounds.y;
      uVar8 = local_58._0_8_;
      local_58.w = bounds.w;
      local_58.h = bounds.h;
      uVar9 = local_58._8_8_;
      local_48 = uVar7;
      if (local_60 == (char *)0x0) {
        __assert_fail("str",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                      ,0x5074,
                      "int nk_do_selectable_symbol(nk_flags *, struct nk_command_buffer *, struct nk_rect, const char *, int, nk_flags, int *, enum nk_symbol_type, const struct nk_style_selectable *, const struct nk_input *, const struct nk_user_font *)"
                     );
      }
      if ((int)local_68 == 0) {
        __assert_fail("len",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                      ,0x5075,
                      "int nk_do_selectable_symbol(nk_flags *, struct nk_command_buffer *, struct nk_rect, const char *, int, nk_flags, int *, enum nk_symbol_type, const struct nk_style_selectable *, const struct nk_input *, const struct nk_user_font *)"
                     );
      }
      if (font == (nk_user_font *)0x0) {
        __assert_fail("font",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                      ,0x5078,
                      "int nk_do_selectable_symbol(nk_flags *, struct nk_command_buffer *, struct nk_rect, const char *, int, nk_flags, int *, enum nk_symbol_type, const struct nk_style_selectable *, const struct nk_input *, const struct nk_user_font *)"
                     );
      }
      iVar3 = *value;
      local_58.x = bounds.x;
      fVar2 = local_58.x;
      local_58.y = bounds.y;
      fVar1 = (ctx->style).selectable.touch_padding.x;
      fVar12 = (ctx->style).selectable.touch_padding.y;
      r.x = local_58.x - fVar1;
      local_74 = local_58.y;
      local_58.w = bounds.w;
      local_7c = local_58.w;
      r.w = fVar1 + fVar1 + local_58.w;
      local_58.h = bounds.h;
      local_78 = local_58.h;
      r.h = fVar12 + fVar12 + local_58.h;
      r.y = local_58.y - fVar12;
      local_58._0_8_ = uVar8;
      local_58._8_8_ = uVar9;
      iVar11 = nk_button_behavior(&ctx->last_widget_state,r,&i->input,NK_BUTTON_DEFAULT);
      if (iVar11 != 0) {
        *value = (uint)(*value == 0);
      }
      fVar1 = (ctx->style).selectable.padding.y;
      local_8c.h = local_78 - (fVar1 + fVar1);
      if ((local_70 & 1) == 0) {
        fVar12 = (ctx->style).selectable.padding.x;
        local_8c.x = fVar12 + fVar12 + fVar2;
      }
      else {
        fVar12 = (ctx->style).selectable.padding.x;
        fVar12 = (fVar2 + local_7c) - (fVar12 + fVar12 + local_8c.h);
        local_8c.x = 0.0;
        if (0.0 <= fVar12) {
          local_8c.x = fVar12;
        }
      }
      out = &pnVar4->buffer;
      fVar12 = (ctx->style).selectable.image_padding.x;
      local_8c.x = local_8c.x + fVar12;
      fVar2 = (ctx->style).selectable.image_padding.y;
      local_8c.y = local_74 + fVar1 + fVar2;
      local_8c.w = local_8c.h - (fVar12 + fVar12);
      local_8c.h = local_8c.h - (fVar2 + fVar2);
      p_Var6 = (ctx->style).selectable.draw_begin;
      if (p_Var6 != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
        (*p_Var6)(out,(nk_handle)(ctx->style).selectable.userdata.ptr);
      }
      nk_draw_selectable(out,ctx->last_widget_state,&(ctx->style).selectable,*value,&local_58,
                         &local_8c,(nk_image *)0x0,(nk_symbol_type)local_48,local_60,(int)local_68,
                         (nk_flags)local_70,font);
      p_Var6 = (ctx->style).selectable.draw_end;
      if (p_Var6 != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
        (*p_Var6)(out,(nk_handle)(ctx->style).selectable.userdata.ptr);
      }
      nVar10 = (nk_widget_layout_states)(iVar3 != *value);
    }
    return nVar10;
  }
  __assert_fail("ctx->current->layout",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                ,0x50e1,
                "int nk_selectable_symbol_text(struct nk_context *, enum nk_symbol_type, const char *, int, nk_flags, int *)"
               );
}

Assistant:

NK_API int
nk_selectable_symbol_text(struct nk_context *ctx, enum nk_symbol_type sym,
    const char *str, int len, nk_flags align, int *value)
{
    struct nk_window *win;
    struct nk_panel *layout;
    const struct nk_input *in;
    const struct nk_style *style;

    enum nk_widget_layout_states state;
    struct nk_rect bounds;

    NK_ASSERT(ctx);
    NK_ASSERT(value);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout || !value)
        return 0;

    win = ctx->current;
    layout = win->layout;
    style = &ctx->style;

    state = nk_widget(&bounds, ctx);
    if (!state) return 0;
    in = (state == NK_WIDGET_ROM || layout->flags & NK_WINDOW_ROM) ? 0 : &ctx->input;
    return nk_do_selectable_symbol(&ctx->last_widget_state, &win->buffer, bounds,
                str, len, align, value, sym, &style->selectable, in, style->font);
}